

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check
          (list_elem<trompeloeil::sequence_matcher> *this)

{
  list_elem<trompeloeil::sequence_matcher> *plVar1;
  list_elem<trompeloeil::sequence_matcher> *plVar2;
  list_elem<trompeloeil::sequence_matcher> *plVar3;
  list_elem<trompeloeil::sequence_matcher> *plVar4;
  list_elem<trompeloeil::sequence_matcher> *plVar5;
  
  plVar5 = *(list_elem<trompeloeil::sequence_matcher> **)(this + 8);
  if (*(list_elem<trompeloeil::sequence_matcher> **)(plVar5 + 0x10) != this) {
    __assert_fail("next->prev == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60d,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  plVar4 = *(list_elem<trompeloeil::sequence_matcher> **)(this + 0x10);
  plVar3 = *(list_elem<trompeloeil::sequence_matcher> **)(plVar4 + 8);
  if (plVar3 != this) {
    __assert_fail("prev->next == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60e,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  if ((plVar4 == this) != (plVar5 == this)) {
    __assert_fail("(next == this) == (prev == this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                  ,0x60f,
                  "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                 );
  }
  do {
    if ((plVar4 == this) != (plVar5 == this)) {
      __assert_fail("(nn == this) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x615,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    plVar1 = *(list_elem<trompeloeil::sequence_matcher> **)(plVar5 + 8);
    if (*(list_elem<trompeloeil::sequence_matcher> **)(plVar1 + 0x10) != plVar5) {
      __assert_fail("nn->next->prev == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x616,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(*(long *)(plVar5 + 0x10) + 8) != plVar5) {
      __assert_fail("nn->prev->next == nn",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x617,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if (*(list_elem<trompeloeil::sequence_matcher> **)(plVar3 + 0x10) != plVar4) {
      __assert_fail("pp->next->prev == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x618,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    plVar2 = *(list_elem<trompeloeil::sequence_matcher> **)(plVar4 + 0x10);
    plVar3 = *(list_elem<trompeloeil::sequence_matcher> **)(plVar2 + 8);
    if (plVar3 != plVar4) {
      __assert_fail("pp->prev->next == pp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x619,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if ((plVar1 != plVar5) == (plVar5 == this)) {
      __assert_fail("(nn->next == nn) == (nn == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61a,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    if ((plVar2 != plVar4) == (plVar4 == this)) {
      __assert_fail("(pp->prev == pp) == (pp == this)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Trompeloeil/trompeloeil.hpp"
                    ,0x61b,
                    "void trompeloeil::list_elem<trompeloeil::sequence_matcher>::invariant_check() const [T = trompeloeil::sequence_matcher]"
                   );
    }
    plVar4 = plVar2;
    plVar5 = plVar1;
  } while (plVar1 != this);
  return;
}

Assistant:

void
    invariant_check()
    const
    noexcept
    {
#ifdef TROMPELOEIL_SANITY_CHECKS
      TROMPELOEIL_ASSERT(next->prev == this);
      TROMPELOEIL_ASSERT(prev->next == this);
      TROMPELOEIL_ASSERT((next == this) == (prev == this));
      TROMPELOEIL_ASSERT((prev->next == next) == (next == this));
      TROMPELOEIL_ASSERT((next->prev == prev) == (prev == this));
      auto pp = prev;
      auto nn = next;
      do {
        TROMPELOEIL_ASSERT((nn == this) == (pp == this));
        TROMPELOEIL_ASSERT(nn->next->prev == nn);
        TROMPELOEIL_ASSERT(nn->prev->next == nn);
        TROMPELOEIL_ASSERT(pp->next->prev == pp);
        TROMPELOEIL_ASSERT(pp->prev->next == pp);
        TROMPELOEIL_ASSERT((nn->next == nn) == (nn == this));
        TROMPELOEIL_ASSERT((pp->prev == pp) == (pp == this));
        nn = nn->next;
        pp = pp->prev;
      } while (nn != this);
#endif
    }